

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_protocol_connect(connectdata *conn,_Bool *protocol_done)

{
  _Bool *p_Var1;
  _Bool _Var2;
  _func_CURLcode_connectdata_ptr__Bool_ptr *p_Var3;
  CURLcode CVar4;
  
  *protocol_done = false;
  _Var2 = (conn->bits).protoconnstart;
  if (((conn->bits).tcpconnect[0] == true) && ((_Var2 & 1U) != 0)) {
    if (conn->handler->connecting != (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
      return CURLE_OK;
    }
  }
  else {
    if ((_Var2 & 1U) != 0) {
      return CURLE_OK;
    }
    CVar4 = Curl_proxy_connect(conn,0);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       ((conn->bits).proxy_ssl_connected[0] != true)) {
      return CURLE_OK;
    }
    if ((((conn->bits).tunnel_proxy == true) && ((conn->bits).httpproxy == true)) &&
       (conn->tunnel_state[0] != TUNNEL_COMPLETE)) {
      return CURLE_OK;
    }
    p_Var1 = &(conn->bits).protoconnstart;
    p_Var3 = conn->handler->connect_it;
    if (p_Var3 == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
      *protocol_done = true;
      protocol_done = p_Var1;
    }
    else {
      CVar4 = (*p_Var3)(conn,protocol_done);
      protocol_done = p_Var1;
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
    }
  }
  *protocol_done = true;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_protocol_connect(struct connectdata *conn,
                               bool *protocol_done)
{
  CURLcode result=CURLE_OK;

  *protocol_done = FALSE;

  if(conn->bits.tcpconnect[FIRSTSOCKET] && conn->bits.protoconnstart) {
    /* We already are connected, get back. This may happen when the connect
       worked fine in the first call, like when we connect to a local server
       or proxy. Note that we don't know if the protocol is actually done.

       Unless this protocol doesn't have any protocol-connect callback, as
       then we know we're done. */
    if(!conn->handler->connecting)
      *protocol_done = TRUE;

    return CURLE_OK;
  }

  if(!conn->bits.protoconnstart) {

    result = Curl_proxy_connect(conn, FIRSTSOCKET);
    if(result)
      return result;

    if(CONNECT_FIRSTSOCKET_PROXY_SSL())
      /* wait for HTTPS proxy SSL initialization to complete */
      return CURLE_OK;

    if(conn->bits.tunnel_proxy && conn->bits.httpproxy &&
       (conn->tunnel_state[FIRSTSOCKET] != TUNNEL_COMPLETE))
      /* when using an HTTP tunnel proxy, await complete tunnel establishment
         before proceeding further. Return CURLE_OK so we'll be called again */
      return CURLE_OK;

    if(conn->handler->connect_it) {
      /* is there a protocol-specific connect() procedure? */

      /* Call the protocol-specific connect function */
      result = conn->handler->connect_it(conn, protocol_done);
    }
    else
      *protocol_done = TRUE;

    /* it has started, possibly even completed but that knowledge isn't stored
       in this bit! */
    if(!result)
      conn->bits.protoconnstart = TRUE;
  }

  return result; /* pass back status */
}